

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_duplicate.cpp
# Opt level: O0

int main(void)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  int iVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  allocator<unsigned_int> local_11d;
  uint local_11c [3];
  iterator local_110;
  size_type local_108;
  undefined1 local_100 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> e3;
  allocator<unsigned_int> local_c9;
  uint local_c8 [6];
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> e2;
  allocator<unsigned_int> local_59;
  uint local_58 [8];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> e1;
  
  e1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._4_4_ = 0;
  local_58[0] = 3;
  local_58[1] = 4;
  local_58[2] = 1;
  local_58[3] = 4;
  local_58[4] = 5;
  local_38 = local_58;
  local_30 = 5;
  std::allocator<unsigned_int>::allocator(&local_59);
  __l_01._M_len = local_30;
  __l_01._M_array = local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,__l_01,&local_59);
  std::allocator<unsigned_int>::~allocator(&local_59);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &e2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  iVar1 = find_duplicate((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &e2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage);
  if (iVar1 != 4) {
    __assert_fail("find_duplicate(e1) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/lukasmartinelli[P]sharpen/challenges/array/array_duplicate.cpp"
                  ,0x15,"int main()");
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &e2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_c8[4] = 5;
  local_c8[5] = 1;
  local_c8[0] = 1;
  local_c8[1] = 2;
  local_c8[2] = 3;
  local_c8[3] = 4;
  local_b0 = local_c8;
  local_a8 = 6;
  std::allocator<unsigned_int>::allocator(&local_c9);
  __l_00._M_len = local_a8;
  __l_00._M_array = local_b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,__l_00,&local_c9);
  std::allocator<unsigned_int>::~allocator(&local_c9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &e3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0);
  iVar1 = find_duplicate((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &e3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage);
  if (iVar1 == 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &e3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_11c[0] = 1;
    local_11c[1] = 2;
    local_11c[2] = 3;
    local_110 = local_11c;
    local_108 = 3;
    std::allocator<unsigned_int>::allocator(&local_11d);
    __l._M_len = local_108;
    __l._M_array = local_110;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,__l,&local_11d);
    std::allocator<unsigned_int>::~allocator(&local_11d);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_138,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
    iVar1 = find_duplicate(&local_138);
    if (iVar1 == -1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_138);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
      return e1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    __assert_fail("find_duplicate(e3) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/lukasmartinelli[P]sharpen/challenges/array/array_duplicate.cpp"
                  ,0x1b,"int main()");
  }
  __assert_fail("find_duplicate(e2) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/lukasmartinelli[P]sharpen/challenges/array/array_duplicate.cpp"
                ,0x18,"int main()");
}

Assistant:

int main() {
    std::vector<uint32_t> e1 = {3, 4, 1, 4, 5};
    assert(find_duplicate(e1) == 4);

    std::vector<uint32_t> e2 = {1, 2, 3, 4, 5, 1};
    assert(find_duplicate(e2) == 1);

    std::vector<uint32_t> e3 = {1, 2, 3};
    assert(find_duplicate(e3) == -1);
}